

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void()>::callback<std::function<void()>>
          (callback<void()> *this,function<void_()> *func)

{
  callable_impl<void,_std::function<void_()>_> *this_00;
  _Any_data local_40;
  _Manager_type local_30;
  
  this_00 = (callable_impl<void,_std::function<void_()>_> *)operator_new(0x30);
  std::function<void_()>::function((function<void_()> *)&local_40,func);
  callback<void_()>::callable_impl<void,_std::function<void_()>_>::callable_impl
            (this_00,(function<void_()> *)&local_40);
  *(callable_impl<void,_std::function<void_()>_> **)this = this_00;
  booster::atomic_counter::inc();
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}